

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::Buffer::Verify(Buffer *this)

{
  bool bVar1;
  ContextInfo *this_00;
  void *local_30;
  void *ptr;
  GLint64 i64;
  Buffer *pBStack_18;
  GLint i;
  Buffer *this_local;
  
  pBStack_18 = this;
  glu::CallLogWrapper::glGetBufferParameteri64v
            (&(this->super_GLWrapper).super_CallLogWrapper,0x92c0,0x8764,(GLint64 *)&ptr);
  if (ptr == (void *)this->size_) {
    glu::CallLogWrapper::glGetBufferParameteriv
              (&(this->super_GLWrapper).super_CallLogWrapper,0x92c0,0x8765,(GLint *)((long)&i64 + 4)
              );
    if (i64._4_4_ == this->usage_) {
      this_00 = deqp::Context::getContextInfo((this->super_GLWrapper).m_context);
      bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_mapbuffer");
      if (bVar1) {
        glu::CallLogWrapper::glGetBufferParameteriv
                  (&(this->super_GLWrapper).super_CallLogWrapper,0x92c0,0x88bb,
                   (GLint *)((long)&i64 + 4));
        if (i64._4_4_ != this->access_) {
          anon_unknown_0::Output
                    ("BUFFER_ACCESS is %d should be %d.\n",(ulong)i64._4_4_,(ulong)this->access_);
          this_local = (Buffer *)&DAT_ffffffffffffffff;
          return (long)this_local;
        }
      }
      else {
        anon_unknown_0::Output("GL_OES_mapbuffer not supported, skipping GL_BUFFER_ACCESS enum");
      }
      glu::CallLogWrapper::glGetBufferParameteriv
                (&(this->super_GLWrapper).super_CallLogWrapper,0x92c0,0x911f,
                 (GLint *)((long)&i64 + 4));
      if (i64._4_4_ == this->access_flags_) {
        glu::CallLogWrapper::glGetBufferParameteriv
                  (&(this->super_GLWrapper).super_CallLogWrapper,0x92c0,0x88bc,
                   (GLint *)((long)&i64 + 4));
        if (i64._4_4_ == this->mapped_) {
          glu::CallLogWrapper::glGetBufferParameteri64v
                    (&(this->super_GLWrapper).super_CallLogWrapper,0x92c0,0x9121,(GLint64 *)&ptr);
          if (ptr == (void *)this->map_offset_) {
            glu::CallLogWrapper::glGetBufferParameteri64v
                      (&(this->super_GLWrapper).super_CallLogWrapper,0x92c0,0x9120,(GLint64 *)&ptr);
            if (ptr == (void *)this->map_length_) {
              glu::CallLogWrapper::glGetBufferPointerv
                        (&(this->super_GLWrapper).super_CallLogWrapper,0x92c0,0x88bd,&local_30);
              if (local_30 == this->map_pointer_) {
                this_local = (Buffer *)0x0;
              }
              else {
                anon_unknown_0::Output
                          ("BUFFER_MAP_POINTER is %p should be %p.\n",local_30,this->map_pointer_);
                this_local = (Buffer *)&DAT_ffffffffffffffff;
              }
            }
            else {
              anon_unknown_0::Output
                        ("BUFFER_MAP_LENGTH is %d should be %d.\n",(ulong)ptr & 0xffffffff,
                         this->map_length_ & 0xffffffff);
              this_local = (Buffer *)&DAT_ffffffffffffffff;
            }
          }
          else {
            anon_unknown_0::Output
                      ("BUFFER_MAP_OFFSET is %d should be %d.\n",(ulong)ptr & 0xffffffff,
                       this->map_offset_ & 0xffffffff);
            this_local = (Buffer *)&DAT_ffffffffffffffff;
          }
        }
        else {
          anon_unknown_0::Output
                    ("BUFFER_MAPPED is %d should be %d.\n",(ulong)i64._4_4_,(ulong)this->mapped_);
          this_local = (Buffer *)&DAT_ffffffffffffffff;
        }
      }
      else {
        anon_unknown_0::Output
                  ("BUFFER_ACCESS_FLAGS is %d should be %d.\n",(ulong)i64._4_4_,
                   (ulong)(uint)this->access_flags_);
        this_local = (Buffer *)&DAT_ffffffffffffffff;
      }
    }
    else {
      anon_unknown_0::Output
                ("BUFFER_USAGE is %d should be %d.\n",(ulong)i64._4_4_,(ulong)this->usage_);
      this_local = (Buffer *)&DAT_ffffffffffffffff;
    }
  }
  else {
    anon_unknown_0::Output
              ("BUFFER_SIZE is %d should be %d.\n",(ulong)ptr & 0xffffffff,this->size_ & 0xffffffff)
    ;
    this_local = (Buffer *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

long Verify()
	{
		GLint   i;
		GLint64 i64;

		glGetBufferParameteri64v(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_SIZE, &i64);
		if (i64 != size_)
		{
			Output("BUFFER_SIZE is %d should be %d.\n", static_cast<GLint>(i64), static_cast<GLint>(size_));
			return ERROR;
		}
		glGetBufferParameteriv(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_USAGE, &i);
		if (i != static_cast<GLint>(usage_))
		{
			Output("BUFFER_USAGE is %d should be %d.\n", i, usage_);
			return ERROR;
		}
		if (this->m_context.getContextInfo().isExtensionSupported("GL_OES_mapbuffer"))
		{
			glGetBufferParameteriv(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_ACCESS, &i);
			if (i != static_cast<GLint>(access_))
			{
				Output("BUFFER_ACCESS is %d should be %d.\n", i, access_);
				return ERROR;
			}
		}
		else
		{
			Output("GL_OES_mapbuffer not supported, skipping GL_BUFFER_ACCESS enum");
		}
		glGetBufferParameteriv(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_ACCESS_FLAGS, &i);
		if (i != access_flags_)
		{
			Output("BUFFER_ACCESS_FLAGS is %d should be %d.\n", i, access_flags_);
			return ERROR;
		}
		glGetBufferParameteriv(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_MAPPED, &i);
		if (i != mapped_)
		{
			Output("BUFFER_MAPPED is %d should be %d.\n", i, mapped_);
			return ERROR;
		}
		glGetBufferParameteri64v(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_MAP_OFFSET, &i64);
		if (i64 != map_offset_)
		{
			Output("BUFFER_MAP_OFFSET is %d should be %d.\n", static_cast<GLint>(i64), static_cast<GLint>(map_offset_));
			return ERROR;
		}
		glGetBufferParameteri64v(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_MAP_LENGTH, &i64);
		if (i64 != map_length_)
		{
			Output("BUFFER_MAP_LENGTH is %d should be %d.\n", static_cast<GLint>(i64), static_cast<GLint>(map_length_));
			return ERROR;
		}
		void* ptr;
		glGetBufferPointerv(GL_ATOMIC_COUNTER_BUFFER, GL_BUFFER_MAP_POINTER, &ptr);
		if (ptr != map_pointer_)
		{
			Output("BUFFER_MAP_POINTER is %p should be %p.\n", ptr, map_pointer_);
			return ERROR;
		}
		return NO_ERROR;
	}